

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diyfp.h
# Opt level: O2

DiyFp rapidjson::internal::GetCachedPower(int e,int *K)

{
  int iVar1;
  ulong uVar2;
  double dVar3;
  DiyFp DVar4;
  
  dVar3 = (double)(-0x3d - e) * 0.30102999566398114 + 347.0;
  iVar1 = (int)((uint)((double)(int)dVar3 < dVar3) + (int)dVar3) >> 3;
  uVar2 = (ulong)(iVar1 + 1);
  *K = 0x15c - (iVar1 * 8 + 8);
  DVar4.e = (int)*(short *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_E + uVar2 * 2);
  DVar4.f = *(undefined8 *)(GetCachedPowerByIndex(unsigned_long)::kCachedPowers_F + uVar2 * 8);
  DVar4._12_4_ = 0;
  return DVar4;
}

Assistant:

inline DiyFp GetCachedPower(int e, int* K) {

    //int k = static_cast<int>(ceil((-61 - e) * 0.30102999566398114)) + 374;
    double dk = (-61 - e) * 0.30102999566398114 + 347;  // dk must be positive, so can do ceiling in positive
    int k = static_cast<int>(dk);
    if (dk - k > 0.0)
        k++;

    unsigned index = static_cast<unsigned>((k >> 3) + 1);
    *K = -(-348 + static_cast<int>(index << 3));    // decimal exponent no need lookup table

    return GetCachedPowerByIndex(index);
}